

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall cmGeneratorTarget::AddHIPArchitectureFlags(cmGeneratorTarget *this,string *flags)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  bool bVar2;
  string *psVar3;
  string *__rhs;
  long *plVar4;
  size_type *psVar5;
  size_type sVar6;
  _Alloc_hider __rhs_00;
  string_view value;
  string_view arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"HIP_ARCHITECTURES","");
  psVar3 = (string *)GetProperty(this,&local_78);
  if (psVar3 == (string *)0x0) {
    psVar3 = &cmValue::Empty_abi_cxx11_;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  sVar6 = psVar3->_M_string_length;
  if (sVar6 == 0) {
    this_00 = this->Makefile;
    __rhs = cmTarget::GetName_abi_cxx11_(this->Target);
    std::operator+(&local_58,"HIP_ARCHITECTURES is empty for target \"",__rhs);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_58);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_78.field_2._M_allocated_capacity = *psVar5;
      local_78.field_2._8_8_ = plVar4[3];
      local_78._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_78.field_2._M_allocated_capacity = *psVar5;
      local_78._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_78._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    sVar6 = psVar3->_M_string_length;
  }
  value._M_str = (psVar3->_M_dataplus)._M_p;
  value._M_len = sVar6;
  bVar2 = cmValue::IsOff(value);
  if (!bVar2) {
    local_58._M_dataplus._M_p = (pointer)0x0;
    local_58._M_string_length = 0;
    local_58.field_2._M_allocated_capacity = 0;
    arg._M_str = (psVar3->_M_dataplus)._M_p;
    arg._M_len = psVar3->_M_string_length;
    cmExpandList(arg,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_58,false);
    sVar6 = local_58._M_string_length;
    for (__rhs_00._M_p = local_58._M_dataplus._M_p; __rhs_00._M_p != (pointer)sVar6;
        __rhs_00._M_p = __rhs_00._M_p + 0x20) {
      std::operator+(&local_78," --offload-arch=",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __rhs_00._M_p);
      std::__cxx11::string::_M_append((char *)flags,(ulong)local_78._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_58);
  }
  return;
}

Assistant:

void cmGeneratorTarget::AddHIPArchitectureFlags(std::string& flags) const
{
  const std::string& property = this->GetSafeProperty("HIP_ARCHITECTURES");

  if (property.empty()) {
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 "HIP_ARCHITECTURES is empty for target \"" +
                                   this->GetName() + "\".");
  }

  // If HIP_ARCHITECTURES is false we don't add any architectures.
  if (cmIsOff(property)) {
    return;
  }

  std::vector<std::string> options;
  cmExpandList(property, options);

  for (std::string& option : options) {
    flags += " --offload-arch=" + option;
  }
}